

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void stbir__decode_and_resample_upsample(stbir__info *stbir_info,int n)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  
  stbir__decode_scanline(stbir_info,n);
  stbir_info->ring_buffer_last_scanline = n;
  iVar3 = stbir_info->ring_buffer_begin_index;
  if (stbir_info->horizontal_scale <= 1.0) {
    if (iVar3 < 0) {
      stbir_info->ring_buffer_begin_index = 0;
      stbir_info->ring_buffer_first_scanline = n;
      iVar3 = 0;
    }
    else {
      iVar3 = ((iVar3 + n) - stbir_info->ring_buffer_first_scanline) %
              stbir_info->ring_buffer_num_entries;
    }
    iVar1 = stbir_info->ring_buffer_length_bytes;
    pfVar2 = stbir_info->ring_buffer;
    memset(pfVar2 + (iVar1 >> 2) * iVar3,0,(long)iVar1);
    stbir__resample_horizontal_downsample(stbir_info,pfVar2 + (iVar1 >> 2) * iVar3);
    return;
  }
  if (iVar3 < 0) {
    stbir_info->ring_buffer_begin_index = 0;
    stbir_info->ring_buffer_first_scanline = n;
    iVar3 = 0;
  }
  else {
    iVar3 = ((iVar3 + n) - stbir_info->ring_buffer_first_scanline) %
            stbir_info->ring_buffer_num_entries;
  }
  iVar1 = stbir_info->ring_buffer_length_bytes;
  pfVar2 = stbir_info->ring_buffer;
  memset(pfVar2 + (iVar1 >> 2) * iVar3,0,(long)iVar1);
  stbir__resample_horizontal_upsample(stbir_info,pfVar2 + (iVar1 >> 2) * iVar3);
  return;
}

Assistant:

static void stbir__decode_and_resample_upsample(stbir__info* stbir_info, int n)
{
    // Decode the nth scanline from the source image into the decode buffer.
    stbir__decode_scanline(stbir_info, n);

    // Now resample it into the ring buffer.
    if (stbir__use_width_upsampling(stbir_info))
        stbir__resample_horizontal_upsample(stbir_info, stbir__add_empty_ring_buffer_entry(stbir_info, n));
    else
        stbir__resample_horizontal_downsample(stbir_info, stbir__add_empty_ring_buffer_entry(stbir_info, n));

    // Now it's sitting in the ring buffer ready to be used as source for the vertical sampling.
}